

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::inv_Phi_approx<float>(float x)

{
  int *piVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  float q_2;
  float r;
  float q_1;
  float q;
  undefined4 local_4;
  
  if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      if (0.02425 <= in_XMM0_Da) {
        if (0.97575 <= in_XMM0_Da) {
          fVar2 = ln1p(0.0);
          dVar4 = std::sqrt((double)(ulong)(uint)(fVar2 * -2.0));
          fVar2 = SUB84(dVar4,0);
          local_4 = -(((((fVar2 * -0.007784894 + -0.32239646) * fVar2 + -2.4007583) * fVar2 +
                       -2.5497324) * fVar2 + 4.3746643) * fVar2 + 2.938164) /
                    ((((fVar2 * 0.007784696 + 0.32246712) * fVar2 + 2.4451342) * fVar2 + 3.7544086)
                     * fVar2 + 1.0);
        }
        else {
          fVar2 = in_XMM0_Da - 0.5;
          fVar3 = fVar2 * fVar2;
          local_4 = ((((((fVar3 * -39.69683 + 220.9461) * fVar3 + -275.9285) * fVar3 + 138.35776) *
                       fVar3 + -30.664799) * fVar3 + 2.5066283) * fVar2) /
                    (((((fVar3 * -54.476097 + 161.58583) * fVar3 + -155.69897) * fVar3 + 66.801315)
                      * fVar3 + -13.280682) * fVar3 + 1.0);
        }
      }
      else {
        fVar2 = ln(0.0);
        dVar4 = std::sqrt((double)(ulong)(uint)(fVar2 * -2.0));
        fVar2 = SUB84(dVar4,0);
        local_4 = (((((fVar2 * -0.007784894 + -0.32239646) * fVar2 + -2.4007583) * fVar2 +
                    -2.5497324) * fVar2 + 4.3746643) * fVar2 + 2.938164) /
                  ((((fVar2 * 0.007784696 + 0.32246712) * fVar2 + 2.4451342) * fVar2 + 3.7544086) *
                   fVar2 + 1.0);
      }
    }
    else {
      local_4 = std::numeric_limits<float>::infinity();
    }
  }
  else {
    local_4 = std::numeric_limits<float>::infinity();
    local_4 = -local_4;
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Phi_approx(T x) {
        using traits = inv_Phi_traits<T>;
        if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        if (x == 0)
          return -numeric_limits<T>::infinity();
        if (x == 1)
          return numeric_limits<T>::infinity();
        if (x < traits::x_low) {
          // rational approximation for lower region
          const T q{sqrt(-2 * ln(x))};
          return (((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q + traits::c[3]) *
                       q +
                   traits::c[4]) *
                      q +
                  traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        } else if (x < traits::x_high) {
          // rational approximation for central region
          const T q{x - traits::one_half};
          const T r{q * q};
          return (((((traits::a[0] * r + traits::a[1]) * r + traits::a[2]) * r + traits::a[3]) *
                       r +
                   traits::a[4]) *
                      r +
                  traits::a[5]) *
                 q /
                 (((((traits::b[0] * r + traits::b[1]) * r + traits::b[2]) * r + traits::b[3]) *
                       r +
                   traits::b[4]) *
                      r +
                  1);
        } else {
          // rational approximation for upper region
          const T q{sqrt(-2 * ln1p(-x))};
          return -(((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q +
                     traits::c[3]) *
                        q +
                    traits::c[4]) *
                       q +
                   traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        }
      }